

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O2

void __thiscall tfnw::TransferFunctionWidget::TransferFunctionWidget(TransferFunctionWidget *this)

{
  initializer_list<tfnw::TransferFunctionWidget::vec2f> __l;
  allocator_type local_39;
  string local_38;
  
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->selected_colormap = 0;
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0x3f8000003f800000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_38;
  std::
  vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
  ::vector(&this->alpha_control_pts,__l,&local_39);
  this->selected_point = 0xffffffffffffffff;
  this->clicked_on_item = false;
  this->gpu_image_stale = true;
  this->colormap_changed = true;
  this->colormap_img = 0xffffffff;
  std::__cxx11::string::string((string *)&local_38,"ParaView Cool Warm",(allocator *)&local_39);
  load_embedded_preset(this,paraview_cool_warm,0x1b3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Rainbow",(allocator *)&local_39);
  load_embedded_preset(this,rainbow,0x7f,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Matplotlib Plasma",(allocator *)&local_39);
  load_embedded_preset(this,matplotlib_plasma,0x17f,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Matplotlib Virdis",(allocator *)&local_39);
  load_embedded_preset(this,matplotlib_virdis,0x17b,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Samsel Linear Green",(allocator *)&local_39);
  load_embedded_preset(this,samsel_linear_green,0x18b,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Samsel Linear YGB 1211G",(allocator *)&local_39)
  ;
  load_embedded_preset(this,samsel_linear_ygb_1211g,0x1ac,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Cool Warm Extended",(allocator *)&local_39);
  load_embedded_preset(this,cool_warm_extended,0x1ea,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Black Body",(allocator *)&local_39);
  load_embedded_preset(this,blackbody,0x8b,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Jet",(allocator *)&local_39);
  load_embedded_preset(this,jet,0xce,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Blue Gold",(allocator *)&local_39);
  load_embedded_preset(this,blue_gold,0x168,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"Ice Fire",(allocator *)&local_39);
  load_embedded_preset(this,ice_fire,0x203,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"nic Edge",(allocator *)&local_39);
  load_embedded_preset(this,nic_edge,0x230,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  update_colormap(this);
  return;
}

Assistant:

TransferFunctionWidget::TransferFunctionWidget()
{
    // Load up the embedded colormaps as the default options
    load_embedded_preset(paraview_cool_warm, sizeof(paraview_cool_warm), "ParaView Cool Warm");
    load_embedded_preset(rainbow, sizeof(rainbow), "Rainbow");
    load_embedded_preset(matplotlib_plasma, sizeof(matplotlib_plasma), "Matplotlib Plasma");
    load_embedded_preset(matplotlib_virdis, sizeof(matplotlib_virdis), "Matplotlib Virdis");
    load_embedded_preset(
        samsel_linear_green, sizeof(samsel_linear_green), "Samsel Linear Green");
    load_embedded_preset(
        samsel_linear_ygb_1211g, sizeof(samsel_linear_ygb_1211g), "Samsel Linear YGB 1211G");
    load_embedded_preset(cool_warm_extended, sizeof(cool_warm_extended), "Cool Warm Extended");
    load_embedded_preset(blackbody, sizeof(blackbody), "Black Body");
    load_embedded_preset(jet, sizeof(jet), "Jet");
    load_embedded_preset(blue_gold, sizeof(blue_gold), "Blue Gold");
    load_embedded_preset(ice_fire, sizeof(ice_fire), "Ice Fire");
    load_embedded_preset(nic_edge, sizeof(nic_edge), "nic Edge");

    // Initialize the colormap alpha channel w/ a linear ramp
    update_colormap();
}